

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psquare_suite.cpp
# Opt level: O0

void double_approx_suite::test_count_100(void)

{
  double absolute_tolerance;
  initializer_list<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>
  __l;
  close_to<double> predicate;
  initializer_list<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>
  __l_00;
  iterator first_begin;
  iterator first_end;
  iterator second_begin;
  iterator second_end;
  double *in_stack_fffffffffffffd98;
  parameter_type local_200;
  parameter_type local_1f0;
  parameter_type local_1e0;
  parameter_type local_1d0;
  parameter_type local_1c0;
  parameter_type *local_1b0;
  undefined8 local_1a8;
  undefined1 local_1a0 [8];
  vector<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
  params;
  double local_170;
  value_type_conflict local_168 [3];
  allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type> local_149
  ;
  parameter_type local_148;
  parameter_type local_138;
  parameter_type local_128;
  parameter_type local_118;
  parameter_type local_108;
  parameter_type *local_f8;
  size_type local_f0;
  undefined1 local_e8 [8];
  vector<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
  expected;
  anon_class_8_1_3f2e7c19 parameter_tolerance;
  close_to<double> tolerance;
  double tolerance_threshold;
  psquare_median<double> quantile;
  
  trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::psquare
            ((psquare<double,_std::ratio<1L,_2L>_> *)&tolerance_threshold);
  absolute_tolerance = std::numeric_limits<double>::min();
  trial::online::detail::close_to<double>::close_to
            ((close_to<double> *)&parameter_tolerance,1e-05,absolute_tolerance);
  expected.
  super__Vector_base<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x3ee4f8b588e368f1;
  trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type::parameter_type
            (&local_148,0x14,-2.0);
  trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type::parameter_type
            (&local_138,0x28,0.5);
  trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type::parameter_type
            (&local_128,0x3c,1.0);
  trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type::parameter_type
            (&local_118,0x50,1.5);
  trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type::parameter_type
            (&local_108,100,4.0);
  local_f0 = 5;
  local_f8 = &local_148;
  std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>::
  allocator(&local_149);
  __l_00._M_len = local_f0;
  __l_00._M_array = local_f8;
  std::
  vector<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
  ::vector((vector<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
            *)local_e8,__l_00,&local_149);
  std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>::
  ~allocator(&local_149);
  trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameters
            ((psquare<double,_std::ratio<1L,_2L>_> *)&tolerance_threshold,
             (vector<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
              *)local_e8);
  trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::push
            ((psquare<double,_std::ratio<1L,_2L>_> *)&tolerance_threshold,1000.0);
  local_168[0] = trial::online::quantile::psquare<double,std::ratio<1l,2l>>::
                 value<std::ratio<1l,2l>>((psquare<double,std::ratio<1l,2l>> *)&tolerance_threshold)
  ;
  local_170 = 1.023782;
  params.
  super__Vector_base<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)parameter_tolerance.tolerance_threshold;
  predicate.absolute = tolerance.relative;
  predicate.relative = parameter_tolerance.tolerance_threshold;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value()","1.023782","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x36f,0x132a05,(char *)local_168,&local_170,in_stack_fffffffffffffd98,
             predicate);
  trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameters
            ((vector<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
              *)local_1a0,(psquare<double,_std::ratio<1L,_2L>_> *)&tolerance_threshold);
  trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type::parameter_type
            (&local_200,0x14,-2.0);
  trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type::parameter_type
            (&local_1f0,0x29,0.5725);
  trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type::parameter_type
            (&local_1e0,0x3d,1.023782);
  trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type::parameter_type
            (&local_1d0,0x51,25.28634);
  trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type::parameter_type
            (&local_1c0,0x65,1000.0);
  local_1a8 = 5;
  __l._M_len = 5;
  __l._M_array = &local_200;
  local_1b0 = &local_200;
  std::
  vector<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
  ::operator=((vector<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
               *)local_e8,__l);
  first_begin = std::
                vector<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
                ::begin((vector<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
                         *)local_1a0);
  first_end = std::
              vector<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
              ::end((vector<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
                     *)local_1a0);
  second_begin = std::
                 vector<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
                 ::begin((vector<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
                          *)local_e8);
  second_end = std::
               vector<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
               ::end((vector<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
                      *)local_e8);
  boost::detail::
  test_all_with_impl<std::ostream,__gnu_cxx::__normal_iterator<trial::online::quantile::psquare<double,std::ratio<1l,2l>>::parameter_type*,std::vector<trial::online::quantile::psquare<double,std::ratio<1l,2l>>::parameter_type,std::allocator<trial::online::quantile::psquare<double,std::ratio<1l,2l>>::parameter_type>>>,__gnu_cxx::__normal_iterator<trial::online::quantile::psquare<double,std::ratio<1l,2l>>::parameter_type*,std::vector<trial::online::quantile::psquare<double,std::ratio<1l,2l>>::parameter_type,std::allocator<trial::online::quantile::psquare<double,std::ratio<1l,2l>>::parameter_type>>>,double_approx_suite::test_count_100()::__0>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,0x372,"void double_approx_suite::test_count_100()",
             (__normal_iterator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type_*,_std::vector<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>_>
              )first_begin._M_current,
             (__normal_iterator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type_*,_std::vector<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>_>
              )first_end._M_current,
             (__normal_iterator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type_*,_std::vector<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>_>
              )second_begin._M_current,
             (__normal_iterator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type_*,_std::vector<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>_>
              )second_end._M_current,
             (anon_class_8_1_3f2e7c19)
             expected.
             super__Vector_base<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
  ::~vector((vector<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
             *)local_1a0);
  std::
  vector<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
  ::~vector((vector<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
             *)local_e8);
  return;
}

Assistant:

void test_count_100()
{
    quantile::psquare_median<double> quantile;
    const double tolerance_threshold = 1e-5;
    const auto tolerance = detail::close_to<double>(tolerance_threshold);
    auto parameter_tolerance =
        [tolerance_threshold]
        (const decltype(quantile)::parameter_type& lhs, const decltype(quantile)::parameter_type& rhs)
        {
            return ((lhs.position == rhs.position) &&
                    std::fabs(lhs.height - rhs.height) <= tolerance_threshold);
        };

    // Approximate normal distribution with expectation 1 and spread 1 after 100 iterations.
    decltype(quantile.parameters()) expected = {
        { 20, -2.0 },
        { 40, 0.5 },
        { 60, 1.0 },
        { 80, 1.5 },
        { 100, 4.0 } };
    quantile.parameters(expected);

    quantile.push(1000.0);
    TRIAL_TEST_WITH(quantile.value(), 1.023782, tolerance);
    auto params = quantile.parameters();
    expected = { {20, -2.0}, {41, 0.5725}, {61, 1.023782}, {81, 25.28634}, {101, 1000.0} };
    TRIAL_TEST_ALL_WITH(params.begin(), params.end(), expected.begin(), expected.end(), parameter_tolerance);
}